

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

void drmp3d_synth(float *xl,drmp3d_sample_t *dstl,int nch,float *lins)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  float *pfVar22;
  drmp3d_sample_t *pcm;
  float *pfVar23;
  drmp3_f4 vy_7;
  drmp3_f4 vz_7;
  drmp3_f4 w1_7;
  drmp3_f4 w0_7;
  drmp3_f4 vy_6;
  drmp3_f4 vz_6;
  drmp3_f4 w1_6;
  drmp3_f4 w0_6;
  drmp3_f4 vy_5;
  drmp3_f4 vz_5;
  drmp3_f4 w1_5;
  drmp3_f4 w0_5;
  drmp3_f4 vy_4;
  drmp3_f4 vz_4;
  drmp3_f4 w1_4;
  drmp3_f4 w0_4;
  drmp3_f4 vy_3;
  drmp3_f4 vz_3;
  drmp3_f4 w1_3;
  drmp3_f4 w0_3;
  drmp3_f4 vy_2;
  drmp3_f4 vz_2;
  drmp3_f4 w1_2;
  drmp3_f4 w0_2;
  drmp3_f4 vy_1;
  drmp3_f4 vz_1;
  drmp3_f4 w1_1;
  drmp3_f4 w0_1;
  drmp3_f4 vy;
  drmp3_f4 vz;
  drmp3_f4 w1;
  drmp3_f4 w0;
  drmp3_f4 b;
  drmp3_f4 a;
  float *local_bd0;
  float *w;
  float *zlin;
  drmp3d_sample_t *dstr;
  float *xr;
  int i;
  float *lins_local;
  int nch_local;
  drmp3d_sample_t *dstl_local;
  float *xl_local;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  
  pfVar22 = xl + (nch + -1) * 0x240;
  pcm = dstl + (nch + -1);
  local_bd0 = drmp3d_synth::g_win;
  lins[0x3fc] = xl[0x120];
  lins[0x3fd] = pfVar22[0x120];
  lins[0x3fe] = *xl;
  lins[0x3ff] = *pfVar22;
  lins[0x43c] = xl[0x121];
  lins[0x43d] = pfVar22[0x121];
  lins[0x43e] = xl[1];
  lins[0x43f] = pfVar22[1];
  drmp3d_synth_pair(pcm,nch,lins + 0x3d);
  drmp3d_synth_pair(pcm + (nch << 5),nch,lins + 0x7d);
  drmp3d_synth_pair(dstl,nch,lins + 0x3c);
  drmp3d_synth_pair(dstl + (nch << 5),nch,lins + 0x7c);
  iVar21 = drmp3_have_simd();
  if (iVar21 != 0) {
    for (xr._4_4_ = 0xe; -1 < xr._4_4_; xr._4_4_ = xr._4_4_ + -1) {
      lins[(long)(xr._4_4_ << 2) + 0x3c0] = xl[(0x1f - xr._4_4_) * 0x12];
      lins[(long)(xr._4_4_ << 2) + 0x3c1] = pfVar22[(0x1f - xr._4_4_) * 0x12];
      lins[(long)(xr._4_4_ << 2) + 0x3c2] = xl[(long)((0x1f - xr._4_4_) * 0x12) + 1];
      lins[(long)(xr._4_4_ << 2) + 0x3c3] = pfVar22[(long)((0x1f - xr._4_4_) * 0x12) + 1];
      lins[(long)(xr._4_4_ << 2) + 0x400] = xl[(long)(xr._4_4_ * 0x12 + 0x12) + 1];
      lins[(long)(xr._4_4_ << 2) + 0x401] = pfVar22[(long)(xr._4_4_ * 0x12 + 0x12) + 1];
      lins[(long)(xr._4_4_ * 4 + -0x40) + 0x3c2] = xl[xr._4_4_ * 0x12 + 0x12];
      lins[(long)(xr._4_4_ * 4 + -0x40) + 0x3c3] = pfVar22[xr._4_4_ * 0x12 + 0x12];
      fVar1 = *local_bd0;
      fVar2 = local_bd0[1];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ << 2) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ << 2) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x3c0) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x3c0) + 0x3c0 + 2);
      local_318 = (float)uVar17;
      fStack_314 = (float)((ulong)uVar17 >> 0x20);
      fStack_310 = (float)uVar18;
      fStack_30c = (float)((ulong)uVar18 >> 0x20);
      local_338 = (float)uVar19;
      fStack_334 = (float)((ulong)uVar19 >> 0x20);
      fStack_330 = (float)uVar20;
      fStack_32c = (float)((ulong)uVar20 >> 0x20);
      fVar3 = local_bd0[2];
      fVar4 = local_bd0[3];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x40) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x40) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x380) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x380) + 0x3c0 + 2);
      local_398 = (float)uVar17;
      fStack_394 = (float)((ulong)uVar17 >> 0x20);
      fStack_390 = (float)uVar18;
      fStack_38c = (float)((ulong)uVar18 >> 0x20);
      local_3b8 = (float)uVar19;
      fStack_3b4 = (float)((ulong)uVar19 >> 0x20);
      fStack_3b0 = (float)uVar20;
      fStack_3ac = (float)((ulong)uVar20 >> 0x20);
      fVar5 = local_bd0[4];
      fVar6 = local_bd0[5];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x80) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x80) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x340) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x340) + 0x3c0 + 2);
      local_418 = (float)uVar17;
      fStack_414 = (float)((ulong)uVar17 >> 0x20);
      fStack_410 = (float)uVar18;
      fStack_40c = (float)((ulong)uVar18 >> 0x20);
      local_438 = (float)uVar19;
      fStack_434 = (float)((ulong)uVar19 >> 0x20);
      fStack_430 = (float)uVar20;
      fStack_42c = (float)((ulong)uVar20 >> 0x20);
      fVar7 = local_bd0[6];
      fVar8 = local_bd0[7];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0xc0) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0xc0) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x300) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x300) + 0x3c0 + 2);
      local_498 = (float)uVar17;
      fStack_494 = (float)((ulong)uVar17 >> 0x20);
      fStack_490 = (float)uVar18;
      fStack_48c = (float)((ulong)uVar18 >> 0x20);
      local_4b8 = (float)uVar19;
      fStack_4b4 = (float)((ulong)uVar19 >> 0x20);
      fStack_4b0 = (float)uVar20;
      fStack_4ac = (float)((ulong)uVar20 >> 0x20);
      fVar9 = local_bd0[8];
      fVar10 = local_bd0[9];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x100) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x100) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x2c0) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x2c0) + 0x3c0 + 2);
      local_518 = (float)uVar17;
      fStack_514 = (float)((ulong)uVar17 >> 0x20);
      fStack_510 = (float)uVar18;
      fStack_50c = (float)((ulong)uVar18 >> 0x20);
      local_538 = (float)uVar19;
      fStack_534 = (float)((ulong)uVar19 >> 0x20);
      fStack_530 = (float)uVar20;
      fStack_52c = (float)((ulong)uVar20 >> 0x20);
      fVar11 = local_bd0[10];
      fVar12 = local_bd0[0xb];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x140) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x140) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x280) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x280) + 0x3c0 + 2);
      local_598 = (float)uVar17;
      fStack_594 = (float)((ulong)uVar17 >> 0x20);
      fStack_590 = (float)uVar18;
      fStack_58c = (float)((ulong)uVar18 >> 0x20);
      local_5b8 = (float)uVar19;
      fStack_5b4 = (float)((ulong)uVar19 >> 0x20);
      fStack_5b0 = (float)uVar20;
      fStack_5ac = (float)((ulong)uVar20 >> 0x20);
      fVar13 = local_bd0[0xc];
      fVar14 = local_bd0[0xd];
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x180) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x180) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x240) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x240) + 0x3c0 + 2);
      local_618 = (float)uVar17;
      fStack_614 = (float)((ulong)uVar17 >> 0x20);
      fStack_610 = (float)uVar18;
      fStack_60c = (float)((ulong)uVar18 >> 0x20);
      local_638 = (float)uVar19;
      fStack_634 = (float)((ulong)uVar19 >> 0x20);
      fStack_630 = (float)uVar20;
      fStack_62c = (float)((ulong)uVar20 >> 0x20);
      pfVar23 = local_bd0 + 0xf;
      fVar15 = local_bd0[0xe];
      local_bd0 = local_bd0 + 0x10;
      fVar16 = *pfVar23;
      uVar17 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x1c0) + 0x3c0);
      uVar18 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x1c0) + 0x3c0 + 2);
      uVar19 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x200) + 0x3c0);
      uVar20 = *(undefined8 *)(lins + (long)(xr._4_4_ * 4 + -0x200) + 0x3c0 + 2);
      local_698 = (float)uVar17;
      fStack_694 = (float)((ulong)uVar17 >> 0x20);
      fStack_690 = (float)uVar18;
      fStack_68c = (float)((ulong)uVar18 >> 0x20);
      local_6b8 = (float)uVar19;
      fStack_6b4 = (float)((ulong)uVar19 >> 0x20);
      fStack_6b0 = (float)uVar20;
      fStack_6ac = (float)((ulong)uVar20 >> 0x20);
      pcm[(0xf - xr._4_4_) * nch] =
           ((fStack_314 * fVar1 - fStack_334 * fVar2) + (fStack_3b4 * fVar4 - fStack_394 * fVar3) +
            (fStack_414 * fVar5 - fStack_434 * fVar6) + (fStack_4b4 * fVar8 - fStack_494 * fVar7) +
            (fStack_514 * fVar9 - fStack_534 * fVar10) + (fStack_5b4 * fVar12 - fStack_594 * fVar11)
            + (fStack_614 * fVar13 - fStack_634 * fVar14) +
           (fStack_6b4 * fVar16 - fStack_694 * fVar15)) * 3.0517578e-05;
      pcm[(xr._4_4_ + 0x11) * nch] =
           (fStack_314 * fVar2 + fStack_334 * fVar1 + fStack_394 * fVar4 + fStack_3b4 * fVar3 +
            fStack_414 * fVar6 + fStack_434 * fVar5 + fStack_494 * fVar8 + fStack_4b4 * fVar7 +
            fStack_514 * fVar10 + fStack_534 * fVar9 + fStack_594 * fVar12 + fStack_5b4 * fVar11 +
            fStack_614 * fVar14 + fStack_634 * fVar13 + fStack_694 * fVar16 + fStack_6b4 * fVar15) *
           3.0517578e-05;
      dstl[(0xf - xr._4_4_) * nch] =
           ((local_318 * fVar1 - local_338 * fVar2) + (local_3b8 * fVar4 - local_398 * fVar3) +
            (local_418 * fVar5 - local_438 * fVar6) + (local_4b8 * fVar8 - local_498 * fVar7) +
            (local_518 * fVar9 - local_538 * fVar10) + (local_5b8 * fVar12 - local_598 * fVar11) +
            (local_618 * fVar13 - local_638 * fVar14) + (local_6b8 * fVar16 - local_698 * fVar15)) *
           3.0517578e-05;
      dstl[(xr._4_4_ + 0x11) * nch] =
           (local_318 * fVar2 + local_338 * fVar1 + local_398 * fVar4 + local_3b8 * fVar3 +
            local_418 * fVar6 + local_438 * fVar5 + local_498 * fVar8 + local_4b8 * fVar7 +
            local_518 * fVar10 + local_538 * fVar9 + local_598 * fVar12 + local_5b8 * fVar11 +
            local_618 * fVar14 + local_638 * fVar13 + local_698 * fVar16 + local_6b8 * fVar15) *
           3.0517578e-05;
      pcm[(0x2f - xr._4_4_) * nch] =
           ((fStack_30c * fVar1 - fStack_32c * fVar2) + (fStack_3ac * fVar4 - fStack_38c * fVar3) +
            (fStack_40c * fVar5 - fStack_42c * fVar6) + (fStack_4ac * fVar8 - fStack_48c * fVar7) +
            (fStack_50c * fVar9 - fStack_52c * fVar10) + (fStack_5ac * fVar12 - fStack_58c * fVar11)
            + (fStack_60c * fVar13 - fStack_62c * fVar14) +
           (fStack_6ac * fVar16 - fStack_68c * fVar15)) * 3.0517578e-05;
      pcm[(xr._4_4_ + 0x31) * nch] =
           (fStack_30c * fVar2 + fStack_32c * fVar1 + fStack_38c * fVar4 + fStack_3ac * fVar3 +
            fStack_40c * fVar6 + fStack_42c * fVar5 + fStack_48c * fVar8 + fStack_4ac * fVar7 +
            fStack_50c * fVar10 + fStack_52c * fVar9 + fStack_58c * fVar12 + fStack_5ac * fVar11 +
            fStack_60c * fVar14 + fStack_62c * fVar13 + fStack_68c * fVar16 + fStack_6ac * fVar15) *
           3.0517578e-05;
      dstl[(0x2f - xr._4_4_) * nch] =
           ((fStack_310 * fVar1 - fStack_330 * fVar2) + (fStack_3b0 * fVar4 - fStack_390 * fVar3) +
            (fStack_410 * fVar5 - fStack_430 * fVar6) + (fStack_4b0 * fVar8 - fStack_490 * fVar7) +
            (fStack_510 * fVar9 - fStack_530 * fVar10) + (fStack_5b0 * fVar12 - fStack_590 * fVar11)
            + (fStack_610 * fVar13 - fStack_630 * fVar14) +
           (fStack_6b0 * fVar16 - fStack_690 * fVar15)) * 3.0517578e-05;
      dstl[(xr._4_4_ + 0x31) * nch] =
           (fStack_310 * fVar2 + fStack_330 * fVar1 + fStack_390 * fVar4 + fStack_3b0 * fVar3 +
            fStack_410 * fVar6 + fStack_430 * fVar5 + fStack_490 * fVar8 + fStack_4b0 * fVar7 +
            fStack_510 * fVar10 + fStack_530 * fVar9 + fStack_590 * fVar12 + fStack_5b0 * fVar11 +
            fStack_610 * fVar14 + fStack_630 * fVar13 + fStack_690 * fVar16 + fStack_6b0 * fVar15) *
           3.0517578e-05;
    }
  }
  return;
}

Assistant:

static void drmp3d_synth(float *xl, drmp3d_sample_t *dstl, int nch, float *lins)
{
    int i;
    float *xr = xl + 576*(nch - 1);
    drmp3d_sample_t *dstr = dstl + (nch - 1);

    static const float g_win[] = {
        -1,26,-31,208,218,401,-519,2063,2000,4788,-5517,7134,5959,35640,-39336,74992,
        -1,24,-35,202,222,347,-581,2080,1952,4425,-5879,7640,5288,33791,-41176,74856,
        -1,21,-38,196,225,294,-645,2087,1893,4063,-6237,8092,4561,31947,-43006,74630,
        -1,19,-41,190,227,244,-711,2085,1822,3705,-6589,8492,3776,30112,-44821,74313,
        -1,17,-45,183,228,197,-779,2075,1739,3351,-6935,8840,2935,28289,-46617,73908,
        -1,16,-49,176,228,153,-848,2057,1644,3004,-7271,9139,2037,26482,-48390,73415,
        -2,14,-53,169,227,111,-919,2032,1535,2663,-7597,9389,1082,24694,-50137,72835,
        -2,13,-58,161,224,72,-991,2001,1414,2330,-7910,9592,70,22929,-51853,72169,
        -2,11,-63,154,221,36,-1064,1962,1280,2006,-8209,9750,-998,21189,-53534,71420,
        -2,10,-68,147,215,2,-1137,1919,1131,1692,-8491,9863,-2122,19478,-55178,70590,
        -3,9,-73,139,208,-29,-1210,1870,970,1388,-8755,9935,-3300,17799,-56778,69679,
        -3,8,-79,132,200,-57,-1283,1817,794,1095,-8998,9966,-4533,16155,-58333,68692,
        -4,7,-85,125,189,-83,-1356,1759,605,814,-9219,9959,-5818,14548,-59838,67629,
        -4,7,-91,117,177,-106,-1428,1698,402,545,-9416,9916,-7154,12980,-61289,66494,
        -5,6,-97,111,163,-127,-1498,1634,185,288,-9585,9838,-8540,11455,-62684,65290
    };
    float *zlin = lins + 15*64;
    const float *w = g_win;

    zlin[4*15]     = xl[18*16];
    zlin[4*15 + 1] = xr[18*16];
    zlin[4*15 + 2] = xl[0];
    zlin[4*15 + 3] = xr[0];

    zlin[4*31]     = xl[1 + 18*16];
    zlin[4*31 + 1] = xr[1 + 18*16];
    zlin[4*31 + 2] = xl[1];
    zlin[4*31 + 3] = xr[1];

    drmp3d_synth_pair(dstr, nch, lins + 4*15 + 1);
    drmp3d_synth_pair(dstr + 32*nch, nch, lins + 4*15 + 64 + 1);
    drmp3d_synth_pair(dstl, nch, lins + 4*15);
    drmp3d_synth_pair(dstl + 32*nch, nch, lins + 4*15 + 64);

#if DRMP3_HAVE_SIMD
    if (drmp3_have_simd()) for (i = 14; i >= 0; i--)
    {
#define DRMP3_VLOAD(k) drmp3_f4 w0 = DRMP3_VSET(*w++); drmp3_f4 w1 = DRMP3_VSET(*w++); drmp3_f4 vz = DRMP3_VLD(&zlin[4*i - 64*k]); drmp3_f4 vy = DRMP3_VLD(&zlin[4*i - 64*(15 - k)]);
#define DRMP3_V0(k) { DRMP3_VLOAD(k) b =               DRMP3_VADD(DRMP3_VMUL(vz, w1), DRMP3_VMUL(vy, w0)) ; a =               DRMP3_VSUB(DRMP3_VMUL(vz, w0), DRMP3_VMUL(vy, w1));  }
#define DRMP3_V1(k) { DRMP3_VLOAD(k) b = DRMP3_VADD(b, DRMP3_VADD(DRMP3_VMUL(vz, w1), DRMP3_VMUL(vy, w0))); a = DRMP3_VADD(a, DRMP3_VSUB(DRMP3_VMUL(vz, w0), DRMP3_VMUL(vy, w1))); }
#define DRMP3_V2(k) { DRMP3_VLOAD(k) b = DRMP3_VADD(b, DRMP3_VADD(DRMP3_VMUL(vz, w1), DRMP3_VMUL(vy, w0))); a = DRMP3_VADD(a, DRMP3_VSUB(DRMP3_VMUL(vy, w1), DRMP3_VMUL(vz, w0))); }
        drmp3_f4 a, b;
        zlin[4*i]     = xl[18*(31 - i)];
        zlin[4*i + 1] = xr[18*(31 - i)];
        zlin[4*i + 2] = xl[1 + 18*(31 - i)];
        zlin[4*i + 3] = xr[1 + 18*(31 - i)];
        zlin[4*i + 64] = xl[1 + 18*(1 + i)];
        zlin[4*i + 64 + 1] = xr[1 + 18*(1 + i)];
        zlin[4*i - 64 + 2] = xl[18*(1 + i)];
        zlin[4*i - 64 + 3] = xr[18*(1 + i)];

        DRMP3_V0(0) DRMP3_V2(1) DRMP3_V1(2) DRMP3_V2(3) DRMP3_V1(4) DRMP3_V2(5) DRMP3_V1(6) DRMP3_V2(7)

        {
#ifndef DR_MP3_FLOAT_OUTPUT
#if DRMP3_HAVE_SSE
            static const drmp3_f4 g_max = { 32767.0f, 32767.0f, 32767.0f, 32767.0f };
            static const drmp3_f4 g_min = { -32768.0f, -32768.0f, -32768.0f, -32768.0f };
            __m128i pcm8 = _mm_packs_epi32(_mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(a, g_max), g_min)),
                                           _mm_cvtps_epi32(_mm_max_ps(_mm_min_ps(b, g_max), g_min)));
            dstr[(15 - i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 1);
            dstr[(17 + i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 5);
            dstl[(15 - i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 0);
            dstl[(17 + i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 4);
            dstr[(47 - i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 3);
            dstr[(49 + i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 7);
            dstl[(47 - i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 2);
            dstl[(49 + i)*nch] = (drmp3_int16)_mm_extract_epi16(pcm8, 6);
#else
            int16x4_t pcma, pcmb;
            a = DRMP3_VADD(a, DRMP3_VSET(0.5f));
            b = DRMP3_VADD(b, DRMP3_VSET(0.5f));
            pcma = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(a), vreinterpretq_s32_u32(vcltq_f32(a, DRMP3_VSET(0)))));
            pcmb = vqmovn_s32(vqaddq_s32(vcvtq_s32_f32(b), vreinterpretq_s32_u32(vcltq_f32(b, DRMP3_VSET(0)))));
            vst1_lane_s16(dstr + (15 - i)*nch, pcma, 1);
            vst1_lane_s16(dstr + (17 + i)*nch, pcmb, 1);
            vst1_lane_s16(dstl + (15 - i)*nch, pcma, 0);
            vst1_lane_s16(dstl + (17 + i)*nch, pcmb, 0);
            vst1_lane_s16(dstr + (47 - i)*nch, pcma, 3);
            vst1_lane_s16(dstr + (49 + i)*nch, pcmb, 3);
            vst1_lane_s16(dstl + (47 - i)*nch, pcma, 2);
            vst1_lane_s16(dstl + (49 + i)*nch, pcmb, 2);
#endif
#else
        #if DRMP3_HAVE_SSE
            static const drmp3_f4 g_scale = { 1.0f/32768.0f, 1.0f/32768.0f, 1.0f/32768.0f, 1.0f/32768.0f };
        #else
            const drmp3_f4 g_scale = vdupq_n_f32(1.0f/32768.0f);
        #endif
            a = DRMP3_VMUL(a, g_scale);
            b = DRMP3_VMUL(b, g_scale);
#if DRMP3_HAVE_SSE
            _mm_store_ss(dstr + (15 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(1, 1, 1, 1)));
            _mm_store_ss(dstr + (17 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(1, 1, 1, 1)));
            _mm_store_ss(dstl + (15 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(0, 0, 0, 0)));
            _mm_store_ss(dstl + (17 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(0, 0, 0, 0)));
            _mm_store_ss(dstr + (47 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(3, 3, 3, 3)));
            _mm_store_ss(dstr + (49 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(3, 3, 3, 3)));
            _mm_store_ss(dstl + (47 - i)*nch, _mm_shuffle_ps(a, a, _MM_SHUFFLE(2, 2, 2, 2)));
            _mm_store_ss(dstl + (49 + i)*nch, _mm_shuffle_ps(b, b, _MM_SHUFFLE(2, 2, 2, 2)));
#else
            vst1q_lane_f32(dstr + (15 - i)*nch, a, 1);
            vst1q_lane_f32(dstr + (17 + i)*nch, b, 1);
            vst1q_lane_f32(dstl + (15 - i)*nch, a, 0);
            vst1q_lane_f32(dstl + (17 + i)*nch, b, 0);
            vst1q_lane_f32(dstr + (47 - i)*nch, a, 3);
            vst1q_lane_f32(dstr + (49 + i)*nch, b, 3);
            vst1q_lane_f32(dstl + (47 - i)*nch, a, 2);
            vst1q_lane_f32(dstl + (49 + i)*nch, b, 2);
#endif
#endif /* DR_MP3_FLOAT_OUTPUT */
        }
    } else
#endif
#ifdef DR_MP3_ONLY_SIMD
    {} /* for HAVE_SIMD=1, MINIMP3_ONLY_SIMD=1 case we do not need non-intrinsic "else" branch */
#else
    for (i = 14; i >= 0; i--)
    {
#define DRMP3_LOAD(k) float w0 = *w++; float w1 = *w++; float *vz = &zlin[4*i - k*64]; float *vy = &zlin[4*i - (15 - k)*64];
#define DRMP3_S0(k) { int j; DRMP3_LOAD(k); for (j = 0; j < 4; j++) b[j]  = vz[j]*w1 + vy[j]*w0, a[j]  = vz[j]*w0 - vy[j]*w1; }
#define DRMP3_S1(k) { int j; DRMP3_LOAD(k); for (j = 0; j < 4; j++) b[j] += vz[j]*w1 + vy[j]*w0, a[j] += vz[j]*w0 - vy[j]*w1; }
#define DRMP3_S2(k) { int j; DRMP3_LOAD(k); for (j = 0; j < 4; j++) b[j] += vz[j]*w1 + vy[j]*w0, a[j] += vy[j]*w1 - vz[j]*w0; }
        float a[4], b[4];

        zlin[4*i]     = xl[18*(31 - i)];
        zlin[4*i + 1] = xr[18*(31 - i)];
        zlin[4*i + 2] = xl[1 + 18*(31 - i)];
        zlin[4*i + 3] = xr[1 + 18*(31 - i)];
        zlin[4*(i + 16)]   = xl[1 + 18*(1 + i)];
        zlin[4*(i + 16) + 1] = xr[1 + 18*(1 + i)];
        zlin[4*(i - 16) + 2] = xl[18*(1 + i)];
        zlin[4*(i - 16) + 3] = xr[18*(1 + i)];

        DRMP3_S0(0) DRMP3_S2(1) DRMP3_S1(2) DRMP3_S2(3) DRMP3_S1(4) DRMP3_S2(5) DRMP3_S1(6) DRMP3_S2(7)

        dstr[(15 - i)*nch] = drmp3d_scale_pcm(a[1]);
        dstr[(17 + i)*nch] = drmp3d_scale_pcm(b[1]);
        dstl[(15 - i)*nch] = drmp3d_scale_pcm(a[0]);
        dstl[(17 + i)*nch] = drmp3d_scale_pcm(b[0]);
        dstr[(47 - i)*nch] = drmp3d_scale_pcm(a[3]);
        dstr[(49 + i)*nch] = drmp3d_scale_pcm(b[3]);
        dstl[(47 - i)*nch] = drmp3d_scale_pcm(a[2]);
        dstl[(49 + i)*nch] = drmp3d_scale_pcm(b[2]);
    }
#endif
}